

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statusor.h
# Opt level: O1

void __thiscall google::protobuf::util::StatusOr<int>::StatusOr(StatusOr<int> *this,int *value)

{
  Status::Status(&this->status_);
  Status::operator=(&this->status_,(Status *)Status::OK);
  this->value_ = *value;
  return;
}

Assistant:

inline StatusOr<T>::StatusOr(const T& value) {
  if (internal::StatusOrHelper::Specialize<T>::IsValueNull(value)) {
    status_ = Status(error::INTERNAL, "nullptr is not a valid argument.");
  } else {
    status_ = Status::OK;
    value_ = value;
  }
}